

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O1

void juzzlin::StreamTest::testWarning_higherLoggingLevel_shouldNotPrintMessage
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  stringstream ss;
  SimpleLogger local_1a0 [8];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  juzzlin::SimpleLogger::setLoggingLevel(Error);
  std::__cxx11::stringstream::stringstream(local_198);
  juzzlin::SimpleLogger::setStream(Warning,local_188);
  juzzlin::SimpleLogger::SimpleLogger(local_1a0);
  poVar1 = (ostream *)juzzlin::SimpleLogger::warning_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  juzzlin::SimpleLogger::~SimpleLogger(local_1a0);
  assertNotString((stringstream *)local_198,message);
  assertNotString((stringstream *)local_198,timestampSeparator);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void testWarning_higherLoggingLevel_shouldNotPrintMessage(const std::string & message, const std::string & timestampSeparator)
{
    L::setLoggingLevel(L::Level::Error);
    std::stringstream ss;
    L::setStream(L::Level::Warning, ss);
    L().warning() << message;
    assertNotMessage(ss, message, timestampSeparator);
}